

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool_test.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_1fe3a5::TokenPoolTest::SetUp(TokenPoolTest *this)

{
  bool bVar1;
  int iVar2;
  
  this->load_avg_ = -1.23456789;
  this->tokens_ = (TokenPool *)0x0;
  unsetenv("MAKEFLAGS");
  iVar2 = pipe(this->fds_);
  if (iVar2 < 0) {
    bVar1 = testing::Test::Check
                      (g_current_test,false,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/tokenpool_test.cc"
                       ,0x41,"false");
    if (!bVar1) {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
  }
  return;
}

Assistant:

virtual void SetUp() {
    load_avg_ = kLoadAverageDefault;
    tokens_ = NULL;
    ENVIRONMENT_CLEAR();
#ifdef _WIN32
    semaphore_name_ = SEMAPHORE_NAME;
    if ((semaphore_ = CreateSemaphore(0, 0, 2, SEMAPHORE_NAME)) == NULL)
#else
    if (pipe(fds_) < 0)
#endif
      ASSERT_TRUE(false);
  }